

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O1

void __thiscall
soinn::ESOINN::ESOINN(ESOINN *this,int dim,int ageMax,int iterationThreshold,double c1,double c2)

{
  no_property local_29;
  double local_28;
  double local_20;
  
  this->dim = dim;
  local_28 = c1;
  local_20 = c2;
  boost::
  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
  ::adjacency_list(&this->graph,&local_29);
  this->ageMax = ageMax;
  this->iterationThreshold = iterationThreshold;
  this->c1 = local_28;
  this->c2 = local_20;
  return;
}

Assistant:

ESOINN::ESOINN(int dim, int ageMax, int iterationThreshold, double c1, double c2):
    dim(dim),
    ageMax(ageMax),
    iterationThreshold(iterationThreshold),
    c1(c1),
    c2(c2)
{
}